

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

int Fraig_NodeSimsContained(Fraig_Man_t *pMan,Fraig_Node_t *pNode1,Fraig_Node_t *pNode2)

{
  int local_3c;
  int i;
  uint *pUnsigned2;
  uint *pUnsigned1;
  Fraig_Node_t *pNode2_local;
  Fraig_Node_t *pNode1_local;
  Fraig_Man_t *pMan_local;
  
  for (local_3c = 0; local_3c < pMan->nWordsRand; local_3c = local_3c + 1) {
    if ((pNode1->puSimR[local_3c] & (pNode2->puSimR[local_3c] ^ 0xffffffff)) != 0) {
      return 0;
    }
  }
  local_3c = 0;
  while( true ) {
    if (pMan->iWordStart <= local_3c) {
      return 1;
    }
    if ((pNode1->puSimD[local_3c] & (pNode2->puSimD[local_3c] ^ 0xffffffff)) != 0) break;
    local_3c = local_3c + 1;
  }
  return 0;
}

Assistant:

int Fraig_NodeSimsContained( Fraig_Man_t * pMan, Fraig_Node_t * pNode1, Fraig_Node_t * pNode2 )
{
    unsigned * pUnsigned1, * pUnsigned2;
    int i;

    // compare random siminfo
    pUnsigned1 = pNode1->puSimR;
    pUnsigned2 = pNode2->puSimR;
    for ( i = 0; i < pMan->nWordsRand; i++ )
        if ( pUnsigned1[i] & ~pUnsigned2[i] )
            return 0;

    // compare systematic siminfo
    pUnsigned1 = pNode1->puSimD;
    pUnsigned2 = pNode2->puSimD;
    for ( i = 0; i < pMan->iWordStart; i++ )
        if ( pUnsigned1[i] & ~pUnsigned2[i] )
            return 0;

    return 1;
}